

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

void __thiscall tinyusdz::ascii::AsciiParser::Setup(AsciiParser *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  *pmVar1;
  AsciiParser *pAVar2;
  mapped_type *pmVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  string sStack_358;
  allocator local_331;
  string local_330;
  allocator local_309;
  VariableDef local_308;
  allocator local_299;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  AsciiParser *local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  key_type local_70;
  PostParseHandler local_50;
  
  pmVar1 = &this->_supported_stage_metas;
  local_138 = this;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::clear(&pmVar1->_M_t);
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_d0);
  ::std::__cxx11::string::string((string *)&local_330,"doc",(allocator *)local_110);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       VariableDef::DefaultPostParseHandler;
  local_50._M_invoker =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,&local_50);
  ::std::__cxx11::string::string((string *)local_90,"doc",(allocator *)local_178);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_90);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_110);
  ::std::__cxx11::string::string((string *)&local_330,"doc",(allocator *)local_178);
  local_90._8_8_ = 0;
  local_90._0_8_ = VariableDef::DefaultPostParseHandler;
  local_80._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_80._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_90);
  ::std::__cxx11::string::string((string *)local_d0,"documentation",(allocator *)local_198);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_d0);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_80._0_8_ != (code *)0x0) {
    (*(code *)local_80._0_8_)(local_90,local_90,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_178);
  ::std::__cxx11::string::string((string *)&local_330,"comment",(allocator *)local_198);
  local_d0._8_8_ = 0;
  local_d0._0_8_ = VariableDef::DefaultPostParseHandler;
  local_c0._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_c0._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_d0);
  ::std::__cxx11::string::string((string *)local_110,"comment",(allocator *)local_1b8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_110);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_c0._0_8_ != (code *)0x0) {
    (*(code *)local_c0._0_8_)(local_d0,local_d0,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"double",(allocator *)local_198);
  ::std::__cxx11::string::string((string *)&local_330,"metersPerUnit",(allocator *)local_1b8);
  local_110._8_8_ = 0;
  local_110._0_8_ = VariableDef::DefaultPostParseHandler;
  local_100._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_100._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_110);
  ::std::__cxx11::string::string((string *)local_178,"metersPerUnit",(allocator *)local_1d8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_178);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(local_110,local_110,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"double",(allocator *)local_1b8);
  ::std::__cxx11::string::string((string *)&local_330,"timeCodesPerSecond",(allocator *)local_1d8);
  local_178._8_8_ = 0;
  local_178._0_8_ = VariableDef::DefaultPostParseHandler;
  local_168._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_168._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_178);
  ::std::__cxx11::string::string((string *)local_198,"timeCodesPerSecond",(allocator *)local_1f8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_198);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_168._0_8_ != (code *)0x0) {
    (*(code *)local_168._0_8_)(local_178,local_178,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"double",(allocator *)local_1d8);
  ::std::__cxx11::string::string((string *)&local_330,"framesPerSecond",(allocator *)local_1f8);
  local_198._8_8_ = 0;
  local_198._0_8_ = VariableDef::DefaultPostParseHandler;
  local_188._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_188._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_198);
  ::std::__cxx11::string::string((string *)local_1b8,"framesPerSecond",(allocator *)local_218);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1b8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_188._0_8_ != (code *)0x0) {
    (*(code *)local_188._0_8_)(local_198,local_198,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"double",(allocator *)local_1f8);
  ::std::__cxx11::string::string((string *)&local_330,"startTimeCode",(allocator *)local_218);
  local_1b8._8_8_ = 0;
  local_1b8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1a8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1a8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1b8);
  ::std::__cxx11::string::string((string *)local_1d8,"startTimeCode",(allocator *)local_238);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1d8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1a8._0_8_ != (code *)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"double",(allocator *)local_218);
  ::std::__cxx11::string::string((string *)&local_330,"endTimeCode",(allocator *)local_238);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1c8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1c8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1d8);
  ::std::__cxx11::string::string((string *)local_1f8,"endTimeCode",(allocator *)local_258);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1f8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1c8._0_8_ != (code *)0x0) {
    (*(code *)local_1c8._0_8_)(local_1d8,local_1d8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_238);
  ::std::__cxx11::string::string((string *)&local_330,"defaultPrim",(allocator *)local_258);
  local_1f8._8_8_ = 0;
  local_1f8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1e8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1e8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1f8);
  ::std::__cxx11::string::string((string *)local_218,"defaultPrim",(allocator *)local_278);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_218);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1e8._0_8_ != (code *)0x0) {
    (*(code *)local_1e8._0_8_)(local_1f8,local_1f8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_258);
  ::std::__cxx11::string::string((string *)&local_330,"upAxis",(allocator *)local_278);
  local_218._8_8_ = 0;
  local_218._0_8_ = VariableDef::DefaultPostParseHandler;
  local_208._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_208._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_218);
  ::std::__cxx11::string::string((string *)local_238,"upAxis",(allocator *)local_298);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_238);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_208._0_8_ != (code *)0x0) {
    (*(code *)local_208._0_8_)(local_218,local_218,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_278);
  ::std::__cxx11::string::string((string *)&local_330,"customLayerData",(allocator *)local_298);
  local_238._8_8_ = 0;
  local_238._0_8_ = VariableDef::DefaultPostParseHandler;
  local_228._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_228._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_238);
  ::std::__cxx11::string::string((string *)local_258,"customLayerData",(allocator *)local_158);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_258);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_228._0_8_ != (code *)0x0) {
    (*(code *)local_228._0_8_)(local_238,local_238,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"asset",(allocator *)local_298);
  ::std::__cxx11::string::string((string *)&local_330,"subLayers",(allocator *)local_158);
  local_258._8_8_ = 0;
  local_258._0_8_ = VariableDef::DefaultPostParseHandler;
  local_248._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_248._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,true,(PostParseHandler *)local_258);
  ::std::__cxx11::string::string((string *)local_278,"subLayers",(allocator *)local_130);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_278);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_248._0_8_ != (code *)0x0) {
    (*(code *)local_248._0_8_)(local_258,local_258,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"double",(allocator *)local_158);
  ::std::__cxx11::string::string((string *)&local_330,"kilogramsPerUnit",(allocator *)local_130);
  local_278._8_8_ = 0;
  local_278._0_8_ = VariableDef::DefaultPostParseHandler;
  local_268._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_268._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_278);
  ::std::__cxx11::string::string((string *)local_298,"kilogramsPerUnit",(allocator *)local_f0);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_298);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_268._0_8_ != (code *)0x0) {
    (*(code *)local_268._0_8_)(local_278,local_278,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"bool",(allocator *)local_130);
  ::std::__cxx11::string::string((string *)&local_330,"autoPlay",(allocator *)local_f0);
  local_298._8_8_ = 0;
  local_298._0_8_ = VariableDef::DefaultPostParseHandler;
  local_288._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_288._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_298);
  ::std::__cxx11::string::string((string *)local_158,"autoPlay",(allocator *)local_b0);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_158);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_288._0_8_ != (code *)0x0) {
    (*(code *)local_288._0_8_)(local_298,local_298,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_f0);
  ::std::__cxx11::string::string((string *)&local_330,"playbackMode",(allocator *)local_b0);
  local_158._8_8_ = 0;
  local_158._0_8_ = VariableDef::DefaultPostParseHandler;
  local_148._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_148._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_158);
  ::std::__cxx11::string::string((string *)local_130,"playbackMode",(allocator *)&local_70);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_130);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_148._0_8_ != (code *)0x0) {
    (*(code *)local_148._0_8_)(local_158,local_158,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  pmVar1 = &local_138->_supported_prim_metas;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::clear(&pmVar1->_M_t);
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_d0);
  ::std::__cxx11::string::string((string *)&local_330,"kind",(allocator *)local_110);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       VariableDef::DefaultPostParseHandler;
  local_50._M_invoker =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,&local_50);
  ::std::__cxx11::string::string((string *)local_90,"kind",(allocator *)local_178);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_90);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_110);
  ::std::__cxx11::string::string((string *)&local_330,"doc",(allocator *)local_178);
  local_90._8_8_ = 0;
  local_90._0_8_ = VariableDef::DefaultPostParseHandler;
  local_80._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_80._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_90);
  ::std::__cxx11::string::string((string *)local_d0,"doc",(allocator *)local_198);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_d0);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_80._0_8_ != (code *)0x0) {
    (*(code *)local_80._0_8_)(local_90,local_90,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"Reference",(allocator *)local_178);
  ::std::__cxx11::string::string((string *)&local_330,"references",(allocator *)local_198);
  local_d0._8_8_ = 0;
  local_d0._0_8_ = VariableDef::DefaultPostParseHandler;
  local_c0._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_c0._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,true,(PostParseHandler *)local_d0);
  ::std::__cxx11::string::string((string *)local_110,"references",(allocator *)local_1b8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_110);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_c0._0_8_ != (code *)0x0) {
    (*(code *)local_c0._0_8_)(local_d0,local_d0,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"Path",(allocator *)local_198);
  ::std::__cxx11::string::string((string *)&local_330,"inherits",(allocator *)local_1b8);
  local_110._8_8_ = 0;
  local_110._0_8_ = VariableDef::DefaultPostParseHandler;
  local_100._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_100._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,true,(PostParseHandler *)local_110);
  ::std::__cxx11::string::string((string *)local_178,"inherits",(allocator *)local_1d8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_178);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(local_110,local_110,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"Payload",(allocator *)local_1b8);
  ::std::__cxx11::string::string((string *)&local_330,"payload",(allocator *)local_1d8);
  local_178._8_8_ = 0;
  local_178._0_8_ = VariableDef::DefaultPostParseHandler;
  local_168._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_168._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,true,(PostParseHandler *)local_178);
  ::std::__cxx11::string::string((string *)local_198,"payload",(allocator *)local_1f8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_198);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_168._0_8_ != (code *)0x0) {
    (*(code *)local_168._0_8_)(local_178,local_178,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"Path",(allocator *)local_1d8);
  ::std::__cxx11::string::string((string *)&local_330,"specializes",(allocator *)local_1f8);
  local_198._8_8_ = 0;
  local_198._0_8_ = VariableDef::DefaultPostParseHandler;
  local_188._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_188._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,true,(PostParseHandler *)local_198);
  ::std::__cxx11::string::string((string *)local_1b8,"specializes",(allocator *)local_218);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1b8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_188._0_8_ != (code *)0x0) {
    (*(code *)local_188._0_8_)(local_198,local_198,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_1f8);
  ::std::__cxx11::string::string((string *)&local_330,"variantSets",(allocator *)local_218);
  local_1b8._8_8_ = 0;
  local_1b8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1a8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1a8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,true,(PostParseHandler *)local_1b8);
  ::std::__cxx11::string::string((string *)local_1d8,"variantSets",(allocator *)local_238);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1d8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1a8._0_8_ != (code *)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_218);
  ::std::__cxx11::string::string((string *)&local_330,"variants",(allocator *)local_238);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1c8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1c8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1d8);
  ::std::__cxx11::string::string((string *)local_1f8,"variants",(allocator *)local_258);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1f8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1c8._0_8_ != (code *)0x0) {
    (*(code *)local_1c8._0_8_)(local_1d8,local_1d8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_238);
  ::std::__cxx11::string::string((string *)&local_330,"assetInfo",(allocator *)local_258);
  local_1f8._8_8_ = 0;
  local_1f8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1e8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1e8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1f8);
  ::std::__cxx11::string::string((string *)local_218,"assetInfo",(allocator *)local_278);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_218);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1e8._0_8_ != (code *)0x0) {
    (*(code *)local_1e8._0_8_)(local_1f8,local_1f8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_258);
  ::std::__cxx11::string::string((string *)&local_330,"customData",(allocator *)local_278);
  local_218._8_8_ = 0;
  local_218._0_8_ = VariableDef::DefaultPostParseHandler;
  local_208._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_208._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_218);
  ::std::__cxx11::string::string((string *)local_238,"customData",(allocator *)local_298);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_238);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_208._0_8_ != (code *)0x0) {
    (*(code *)local_208._0_8_)(local_218,local_218,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"bool",(allocator *)local_278);
  ::std::__cxx11::string::string((string *)&local_330,"active",(allocator *)local_298);
  local_238._8_8_ = 0;
  local_238._0_8_ = VariableDef::DefaultPostParseHandler;
  local_228._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_228._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_238);
  ::std::__cxx11::string::string((string *)local_258,"active",(allocator *)local_158);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_258);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_228._0_8_ != (code *)0x0) {
    (*(code *)local_228._0_8_)(local_238,local_238,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"bool",(allocator *)local_298);
  ::std::__cxx11::string::string((string *)&local_330,"hidden",(allocator *)local_158);
  local_258._8_8_ = 0;
  local_258._0_8_ = VariableDef::DefaultPostParseHandler;
  local_248._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_248._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_258);
  ::std::__cxx11::string::string((string *)local_278,"hidden",(allocator *)local_130);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_278);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_248._0_8_ != (code *)0x0) {
    (*(code *)local_248._0_8_)(local_258,local_258,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"bool",(allocator *)local_158);
  ::std::__cxx11::string::string((string *)&local_330,"instanceable",(allocator *)local_130);
  local_278._8_8_ = 0;
  local_278._0_8_ = VariableDef::DefaultPostParseHandler;
  local_268._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_268._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_278);
  ::std::__cxx11::string::string((string *)local_298,"instanceable",(allocator *)local_f0);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_298);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_268._0_8_ != (code *)0x0) {
    (*(code *)local_268._0_8_)(local_278,local_278,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_330,"token",(allocator *)local_f0);
  tinyusdz::value::Add1DArraySuffix(&sStack_358,&local_330);
  ::std::__cxx11::string::string((string *)local_298,"apiSchemas",(allocator *)local_b0);
  local_158._8_8_ = 0;
  local_158._0_8_ = VariableDef::DefaultPostParseHandler;
  local_148._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_148._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef
            (&local_308,&sStack_358,(string *)local_298,false,(PostParseHandler *)local_158);
  ::std::__cxx11::string::string((string *)local_130,"apiSchemas",(allocator *)&local_70);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_130);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_148._0_8_ != (code *)0x0) {
    (*(code *)local_148._0_8_)(local_158,local_158,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_f0);
  ::std::__cxx11::string::string((string *)&local_330,"sdrMetadata",(allocator *)local_b0);
  local_298._8_8_ = 0;
  local_298._0_8_ = VariableDef::DefaultPostParseHandler;
  local_288._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_288._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_298);
  ::std::__cxx11::string::string((string *)local_130,"sdrMetadata",(allocator *)&local_70);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_130);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_288._0_8_ != (code *)0x0) {
    (*(code *)local_288._0_8_)(local_298,local_298,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_b0);
  ::std::__cxx11::string::string((string *)&local_330,"clips",(allocator *)&local_70);
  local_130._8_8_ = 0;
  local_130._0_8_ = VariableDef::DefaultPostParseHandler;
  local_120._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_120._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_130);
  ::std::__cxx11::string::string((string *)local_f0,"clips",&local_331);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_f0);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_120._0_8_ != (code *)0x0) {
    (*(code *)local_120._0_8_)(local_130,local_130,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)&local_70);
  ::std::__cxx11::string::string((string *)&local_330,"sceneName",&local_331);
  local_f0._8_8_ = 0;
  local_f0._0_8_ = VariableDef::DefaultPostParseHandler;
  local_e0._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_e0._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_f0);
  ::std::__cxx11::string::string((string *)local_b0,"sceneName",&local_309);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_b0);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_e0._0_8_ != (code *)0x0) {
    (*(code *)local_e0._0_8_)(local_f0,local_f0,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",&local_331);
  ::std::__cxx11::string::string((string *)&local_330,"displayName",&local_309);
  local_b0._8_8_ = 0;
  local_b0._0_8_ = VariableDef::DefaultPostParseHandler;
  local_a0._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_a0._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_b0);
  ::std::__cxx11::string::string((string *)&local_70,"displayName",&local_299);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,&local_70);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_a0._0_8_ != (code *)0x0) {
    (*(code *)local_a0._0_8_)(local_b0,local_b0,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  pmVar1 = &local_138->_supported_prop_metas;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  ::clear(&pmVar1->_M_t);
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_d0);
  ::std::__cxx11::string::string((string *)&local_330,"doc",(allocator *)local_110);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object =
       VariableDef::DefaultPostParseHandler;
  local_50._M_invoker =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,&local_50);
  ::std::__cxx11::string::string((string *)local_90,"doc",(allocator *)local_178);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_90);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"bool",(allocator *)local_110);
  ::std::__cxx11::string::string((string *)&local_330,"active",(allocator *)local_178);
  local_90._8_8_ = 0;
  local_90._0_8_ = VariableDef::DefaultPostParseHandler;
  local_80._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_80._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_90);
  ::std::__cxx11::string::string((string *)local_d0,"active",(allocator *)local_198);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_d0);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_80._0_8_ != (code *)0x0) {
    (*(code *)local_80._0_8_)(local_90,local_90,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"bool",(allocator *)local_178);
  ::std::__cxx11::string::string((string *)&local_330,"hidden",(allocator *)local_198);
  local_d0._8_8_ = 0;
  local_d0._0_8_ = VariableDef::DefaultPostParseHandler;
  local_c0._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_c0._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_d0);
  ::std::__cxx11::string::string((string *)local_110,"hidden",(allocator *)local_1b8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_110);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_c0._0_8_ != (code *)0x0) {
    (*(code *)local_c0._0_8_)(local_d0,local_d0,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_198);
  ::std::__cxx11::string::string((string *)&local_330,"customData",(allocator *)local_1b8);
  local_110._8_8_ = 0;
  local_110._0_8_ = VariableDef::DefaultPostParseHandler;
  local_100._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_100._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_110);
  ::std::__cxx11::string::string((string *)local_178,"customData",(allocator *)local_1d8);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_178);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_100._0_8_ != (code *)0x0) {
    (*(code *)local_100._0_8_)(local_110,local_110,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"int",(allocator *)local_1b8);
  ::std::__cxx11::string::string
            ((string *)&local_330,"unauthoredValuesIndex",(allocator *)local_1d8);
  local_178._8_8_ = 0;
  local_178._0_8_ = VariableDef::DefaultPostParseHandler;
  local_168._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_168._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_178);
  ::std::__cxx11::string::string((string *)local_198,"unauthoredValuesIndex",(allocator *)local_1f8)
  ;
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_198);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_168._0_8_ != (code *)0x0) {
    (*(code *)local_168._0_8_)(local_178,local_178,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"int",(allocator *)local_1d8);
  ::std::__cxx11::string::string((string *)&local_330,"elementSize",(allocator *)local_1f8);
  local_198._8_8_ = 0;
  local_198._0_8_ = VariableDef::DefaultPostParseHandler;
  local_188._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_188._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_198);
  ::std::__cxx11::string::string((string *)local_1b8,"elementSize",(allocator *)local_218);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1b8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_188._0_8_ != (code *)0x0) {
    (*(code *)local_188._0_8_)(local_198,local_198,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"double",(allocator *)local_1f8);
  ::std::__cxx11::string::string((string *)&local_330,"weight",(allocator *)local_218);
  local_1b8._8_8_ = 0;
  local_1b8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1a8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1a8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1b8);
  ::std::__cxx11::string::string((string *)local_1d8,"weight",(allocator *)local_238);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1d8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1a8._0_8_ != (code *)0x0) {
    (*(code *)local_1a8._0_8_)(local_1b8,local_1b8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_218);
  ::std::__cxx11::string::string((string *)&local_330,"colorSpace",(allocator *)local_238);
  local_1d8._8_8_ = 0;
  local_1d8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1c8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1c8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1d8);
  ::std::__cxx11::string::string((string *)local_1f8,"colorSpace",(allocator *)local_258);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_1f8);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1c8._0_8_ != (code *)0x0) {
    (*(code *)local_1c8._0_8_)(local_1d8,local_1d8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_238);
  ::std::__cxx11::string::string((string *)&local_330,"interpolation",(allocator *)local_258);
  local_1f8._8_8_ = 0;
  local_1f8._0_8_ = VariableDef::DefaultPostParseHandler;
  local_1e8._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_1e8._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_1f8);
  ::std::__cxx11::string::string((string *)local_218,"interpolation",(allocator *)local_278);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_218);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_1e8._0_8_ != (code *)0x0) {
    (*(code *)local_1e8._0_8_)(local_1f8,local_1f8,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_258);
  ::std::__cxx11::string::string((string *)&local_330,"bindMaterialAs",(allocator *)local_278);
  local_218._8_8_ = 0;
  local_218._0_8_ = VariableDef::DefaultPostParseHandler;
  local_208._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_208._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_218);
  ::std::__cxx11::string::string((string *)local_238,"bindMaterialAs",(allocator *)local_298);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_238);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_208._0_8_ != (code *)0x0) {
    (*(code *)local_208._0_8_)(local_218,local_218,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_278);
  ::std::__cxx11::string::string((string *)&local_330,"connectability",(allocator *)local_298);
  local_238._8_8_ = 0;
  local_238._0_8_ = VariableDef::DefaultPostParseHandler;
  local_228._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_228._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_238);
  ::std::__cxx11::string::string((string *)local_258,"connectability",(allocator *)local_158);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_258);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_228._0_8_ != (code *)0x0) {
    (*(code *)local_228._0_8_)(local_238,local_238,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_298);
  ::std::__cxx11::string::string((string *)&local_330,"renderType",(allocator *)local_158);
  local_258._8_8_ = 0;
  local_258._0_8_ = VariableDef::DefaultPostParseHandler;
  local_248._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_248._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_258);
  ::std::__cxx11::string::string((string *)local_278,"renderType",(allocator *)local_130);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_278);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_248._0_8_ != (code *)0x0) {
    (*(code *)local_248._0_8_)(local_258,local_258,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"token",(allocator *)local_158);
  ::std::__cxx11::string::string((string *)&local_330,"outputName",(allocator *)local_130);
  local_278._8_8_ = 0;
  local_278._0_8_ = VariableDef::DefaultPostParseHandler;
  local_268._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_268._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_278);
  ::std::__cxx11::string::string((string *)local_298,"outputName",(allocator *)local_f0);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_298);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_268._0_8_ != (code *)0x0) {
    (*(code *)local_268._0_8_)(local_278,local_278,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"dictionary",(allocator *)local_130);
  ::std::__cxx11::string::string((string *)&local_330,"sdrMetadata",(allocator *)local_f0);
  local_298._8_8_ = 0;
  local_298._0_8_ = VariableDef::DefaultPostParseHandler;
  local_288._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_288._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_298);
  ::std::__cxx11::string::string((string *)local_158,"sdrMetadata",(allocator *)local_b0);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_158);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_288._0_8_ != (code *)0x0) {
    (*(code *)local_288._0_8_)(local_298,local_298,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_f0);
  ::std::__cxx11::string::string((string *)&local_330,"displayName",(allocator *)local_b0);
  local_158._8_8_ = 0;
  local_158._0_8_ = VariableDef::DefaultPostParseHandler;
  local_148._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_148._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_158);
  ::std::__cxx11::string::string((string *)local_130,"displayName",(allocator *)&local_70);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_130);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_148._0_8_ != (code *)0x0) {
    (*(code *)local_148._0_8_)(local_158,local_158,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&sStack_358,"string",(allocator *)local_b0);
  ::std::__cxx11::string::string((string *)&local_330,"displayGroup",(allocator *)&local_70);
  local_130._8_8_ = 0;
  local_130._0_8_ = VariableDef::DefaultPostParseHandler;
  local_120._8_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_120._0_8_ =
       ::std::
       _Function_handler<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  VariableDef::VariableDef(&local_308,&sStack_358,&local_330,false,(PostParseHandler *)local_130);
  ::std::__cxx11::string::string((string *)local_f0,"displayGroup",&local_331);
  pmVar3 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
           ::operator[](pmVar1,(key_type *)local_f0);
  VariableDef::operator=(pmVar3,&local_308);
  ::std::__cxx11::string::_M_dispose();
  VariableDef::~VariableDef(&local_308);
  if ((code *)local_120._0_8_ != (code *)0x0) {
    (*(code *)local_120._0_8_)(local_130,local_130,3);
  }
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  pAVar2 = local_138;
  psVar4 = &local_138->_supported_prim_attr_types;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)psVar4);
  ::std::__cxx11::string::string((string *)&local_308,"bool",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"int64",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"int",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"int2",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"int3",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"int4",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"uint64",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"uint",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"uint2",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"uint3",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"uint4",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"float",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"float2",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"float3",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"float4",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"double",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"double2",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"double3",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"double4",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"half",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"half2",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"half3",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"half4",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"quath",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"quatf",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"quatd",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"normal3f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"point3f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord2h",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord3h",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord4h",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord2f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord3f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord4f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord2d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord3d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"texCoord4d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"vector3f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"vector4f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"vector3d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"vector4d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"color3h",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"color3f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"color3d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"color4h",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"color4f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"color4d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"matrix2f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"matrix3f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"matrix4f",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"matrix2d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"matrix3d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"matrix4d",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"token",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"string",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"rel",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"asset",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"dictionary",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"variantSet",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  psVar4 = &pAVar2->_supported_prim_types;
  ::std::__cxx11::string::string((string *)&local_308,"Xform",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Sphere",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Cube",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Cone",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Cylinder",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Capsule",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"BasisCurves",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Mesh",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Points",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"GeomSubset",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Scope",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Material",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"NodeGraph",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Shader",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"SphereLight",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"DomeLight",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"DiskLight",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"DistantLight",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"CylinderLight",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Camera",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"SkelRoot",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"Skeleton",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"SkelAnimation",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"BlendShape",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"GPrim",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  psVar4 = &pAVar2->_supported_api_schemas;
  ::std::__cxx11::string::string((string *)&local_308,"MaterialBindingAPI",(allocator *)&sStack_358)
  ;
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_308,"SkelBindingAPI",(allocator *)&sStack_358);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)psVar4,&local_308.type);
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void AsciiParser::Setup() {
  RegisterStageMetas(_supported_stage_metas);
  RegisterPrimMetas(_supported_prim_metas);
  RegisterPropMetas(_supported_prop_metas);
  RegisterPrimAttrTypes(_supported_prim_attr_types);
  RegisterPrimTypes(_supported_prim_types);
  RegisterAPISchemas(_supported_api_schemas);
}